

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void move_termchar(termline *line,termchar *dest,termchar *src)

{
  undefined4 uVar1;
  termchar *src_local;
  termchar *dest_local;
  termline *line_local;
  
  clear_cc(line,(wchar_t)((long)dest - (long)line->chars >> 5));
  dest->chr = src->chr;
  dest->attr = src->attr;
  dest->truecolour = src->truecolour;
  uVar1 = *(undefined4 *)&src->field_0x1c;
  dest->cc_next = src->cc_next;
  *(undefined4 *)&dest->field_0x1c = uVar1;
  if (src->cc_next != L'\0') {
    dest->cc_next = src->cc_next - (int)((long)dest - (long)src >> 5);
  }
  src->cc_next = L'\0';
  return;
}

Assistant:

static void move_termchar(termline *line, termchar *dest, termchar *src)
{
    /* First clear the cc list from the original char, just in case. */
    clear_cc(line, dest - line->chars);

    /* Move the character cell and adjust its cc_next. */
    *dest = *src;                      /* copy everything except cc-list */
    if (src->cc_next)
        dest->cc_next = src->cc_next - (dest-src);

    /* Ensure the original cell doesn't have a cc list. */
    src->cc_next = 0;

#ifdef TERM_CC_DIAGS
    cc_check(line);
#endif
}